

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

void __thiscall
cs::instance_type::parse_define_var(instance_type *this,iterator it,bool constant,bool link)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  signal_types sVar4;
  token_base **pptVar5;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_> *pdVar6;
  runtime_error *this_00;
  byte in_CL;
  byte bVar7;
  byte in_DL;
  iterator in_RDI;
  var *val;
  token_base *root;
  tree_type<cs::token_base_*> *t;
  iterator __end2;
  iterator __begin2;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  *__range2;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  *parallel_list;
  undefined1 in_stack_000007ff;
  iterator *in_stack_00000800;
  runtime_type *in_stack_00000808;
  _Self *in_stack_fffffffffffffeb8;
  _Self *in_stack_fffffffffffffec0;
  undefined6 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff06;
  allocator in_stack_ffffffffffffff07;
  iterator *in_stack_ffffffffffffff08;
  EVP_PKEY_CTX local_c8 [8];
  EVP_PKEY_CTX local_c0 [22];
  undefined1 in_stack_ffffffffffffff56;
  undefined1 in_stack_ffffffffffffff57;
  instance_type *in_stack_ffffffffffffff58;
  iterator in_stack_ffffffffffffff60;
  undefined1 local_90 [8];
  undefined1 *local_88;
  token_signal *local_80;
  tree_node *local_78;
  reference local_70;
  undefined1 in_stack_ffffffffffffffaf;
  var *in_stack_ffffffffffffffb0;
  var_id *in_stack_ffffffffffffffb8;
  domain_manager *in_stack_ffffffffffffffc0;
  undefined6 in_stack_ffffffffffffffe8;
  
  bVar7 = in_DL & 1;
  bVar1 = in_CL & 1;
  pptVar5 = tree_type<cs::token_base_*>::iterator::data
                      ((iterator *)
                       CONCAT17(in_stack_ffffffffffffff07,
                                CONCAT16(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00)));
  iVar3 = (*(*pptVar5)->_vptr_token_base[2])();
  if (iVar3 == 0xf) {
    pptVar5 = tree_type<cs::token_base_*>::iterator::data
                        ((iterator *)
                         CONCAT17(in_stack_ffffffffffffff07,
                                  CONCAT16(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00)));
    pdVar6 = token_parallel::get_parallel((token_parallel *)*pptVar5);
    std::deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>::
    begin((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
           *)in_stack_fffffffffffffeb8);
    std::deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>::
    end((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_> *
        )in_stack_fffffffffffffeb8);
    while (bVar2 = std::operator!=(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8), bVar2) {
      local_70 = std::
                 _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
                 ::operator*((_Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
                              *)&stack0xffffffffffffffb8);
      local_78 = (tree_node *)
                 tree_type<cs::token_base_*>::root
                           ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffeb8);
      parse_define_var((instance_type *)CONCAT17(bVar7,CONCAT16(bVar1,in_stack_ffffffffffffffe8)),
                       in_RDI,SUB81((ulong)pdVar6 >> 0x38,0),SUB81((ulong)pdVar6 >> 0x30,0));
      std::
      _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
      ::operator++(in_stack_fffffffffffffec0);
    }
  }
  else {
    pptVar5 = tree_type<cs::token_base_*>::iterator::data
                        ((iterator *)
                         CONCAT17(in_stack_ffffffffffffff07,
                                  CONCAT16(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00)));
    local_80 = (token_signal *)*pptVar5;
    sVar4 = token_signal::get_signal(local_80);
    if (sVar4 == asi_) {
      if ((bVar7 & 1) == 0) {
        tree_type<cs::token_base_*>::iterator::right(in_stack_ffffffffffffff08);
        runtime_type::parse_expr(in_stack_00000808,in_stack_00000800,(bool)in_stack_000007ff);
      }
      else {
        tree_type<cs::token_base_*>::iterator::right(in_stack_ffffffffffffff08);
        pptVar5 = tree_type<cs::token_base_*>::iterator::data
                            ((iterator *)
                             CONCAT17(in_stack_ffffffffffffff07,
                                      CONCAT16(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00))
                            );
        token_value::get_value((token_value *)*pptVar5);
        cs_impl::any::any((any *)in_stack_fffffffffffffec0,(any *)in_stack_fffffffffffffeb8);
      }
      local_88 = local_90;
      tree_type<cs::token_base_*>::iterator::left(in_stack_ffffffffffffff08);
      pptVar5 = tree_type<cs::token_base_*>::iterator::data
                          ((iterator *)
                           CONCAT17(in_stack_ffffffffffffff07,
                                    CONCAT16(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00)));
      token_id::get_id((token_id *)*pptVar5);
      bVar2 = false;
      if (((bVar7 & 1) == 0) && ((bVar1 & 1) == 0)) {
        cs_impl::any::any((any *)in_stack_fffffffffffffec0,(any *)in_stack_fffffffffffffeb8);
        bVar2 = true;
        copy(local_c0,local_c8);
      }
      else {
        cs_impl::any::any((any *)in_stack_fffffffffffffec0,(any *)in_stack_fffffffffffffeb8);
      }
      domain_manager::add_var_no_return<cs::var_id_const&>
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                 (bool)in_stack_ffffffffffffffaf);
      cs_impl::any::~any((any *)0x4f8c8e);
      if (bVar2) {
        cs_impl::any::~any((any *)0x4f8ca4);
      }
      cs_impl::any::~any((any *)0x4f8cb1);
    }
    else {
      if (sVar4 != bind_) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&stack0xffffffffffffff08,"Wrong grammar for variable definition(6).",
                   (allocator *)&stack0xffffffffffffff07);
        runtime_error::runtime_error(this_00,(string *)in_stack_fffffffffffffeb8);
        __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
      }
      parse_define_structured_binding
                (in_stack_ffffffffffffff58,in_stack_ffffffffffffff60,(bool)in_stack_ffffffffffffff57
                 ,(bool)in_stack_ffffffffffffff56);
    }
  }
  return;
}

Assistant:

void instance_type::parse_define_var(tree_type<token_base *>::iterator it, bool constant, bool link)
	{
		if (it.data()->get_type() == token_types::parallel) {
			auto &parallel_list = static_cast<token_parallel *>(it.data())->get_parallel();
			for (auto &t: parallel_list)
				parse_define_var(t.root(), constant, link);
		}
		else {
			token_base *root = it.data();
			switch (static_cast<token_signal *>(root)->get_signal()) {
			case signal_types::asi_: {
				const var &val = constant ? static_cast<token_value *>(it.right().data())->get_value() : parse_expr(
				                     it.right());
				storage.add_var_no_return(static_cast<token_id *>(it.left().data())->get_id(),
				                          constant || link ? val : copy(val),
				                          constant);
				break;
			}
			case signal_types::bind_: {
				parse_define_structured_binding(it, constant, link);
				break;
			}
			default:
				throw runtime_error("Wrong grammar for variable definition(6).");
			}
		}
	}